

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O0

CURLcode get_url_file_name(char **filename,char *url)

{
  char *pcVar1;
  char *local_28;
  char *pc;
  char *url_local;
  char **filename_local;
  
  *filename = (char *)0x0;
  pcVar1 = strstr(url,"://");
  local_28 = url;
  if (pcVar1 != (char *)0x0) {
    local_28 = pcVar1 + 3;
  }
  pcVar1 = strrchr(local_28,0x2f);
  if ((pcVar1 != (char *)0x0) && (pcVar1[1] != '\0')) {
    pcVar1 = strdup(pcVar1 + 1);
    *filename = pcVar1;
    if (*filename == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode get_url_file_name(char **filename, const char *url)
{
  const char *pc;

  *filename = NULL;

  /* Find and get the remote file name */
  pc = strstr(url, "://");
  if(pc)
    pc += 3;
  else
    pc = url;
  pc = strrchr(pc, '/');

  if(pc) {
    /* duplicate the string beyond the slash */
    pc++;
    if(*pc) {
      *filename = strdup(pc);
      if(!*filename)
        return CURLE_OUT_OF_MEMORY;
    }
  }

  /* in case we built debug enabled, we allow an environment variable
   * named CURL_TESTDIR to prefix the given file name to put it into a
   * specific directory
   */
#ifdef DEBUGBUILD
  {
    char *tdir = curlx_getenv("CURL_TESTDIR");
    if(tdir) {
      char buffer[512]; /* suitably large */
      snprintf(buffer, sizeof(buffer), "%s/%s", tdir, *filename);
      Curl_safefree(*filename);
      *filename = strdup(buffer); /* clone the buffer */
      curl_free(tdir);
    }
  }
#endif

  return CURLE_OK;
}